

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleGlobalVariables(ExpressionTranslateContext *ctx)

{
  VariableData *variable;
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  bool bVar3;
  ScopeData *pSVar4;
  char *pcVar5;
  ExpressionContext *this;
  char cVar6;
  ulong uVar7;
  InplaceStr local_50;
  InplaceStr local_40;
  
  PrintIndentedLine(ctx,"// Global variables");
  this = ctx->ctx;
  if ((this->variables).count != 0) {
    uVar7 = 0;
    do {
      variable = (this->variables).data[uVar7];
      if ((variable->isVmAlloca == false) && (pTVar1 = variable->type, pTVar1 != this->typeVoid)) {
        if ((pTVar1 == (TypeBase *)0x0) ||
           (((pTVar1->typeID != 0x12 ||
             (pp_Var2 = pTVar1[1]._vptr_TypeBase, pp_Var2 == (_func_int **)0x0)) ||
            (*(int *)(pp_Var2 + 1) != 0x18)))) {
          cVar6 = '\0';
        }
        else {
          cVar6 = *(char *)((long)pp_Var2 + 0x121);
        }
        if (variable->importModule == (ModuleData *)0x0) {
          pcVar5 = (variable->name->name).begin;
          if (4 < (uint)(*(int *)&(variable->name->name).end - (int)pcVar5)) {
            local_40.end = pcVar5 + 5;
            local_50.begin = "$temp";
            local_50.end = "";
            local_40.begin = pcVar5;
            bVar3 = InplaceStr::operator==(&local_40,&local_50);
            pcVar5 = "static ";
            if (bVar3) goto LAB_00146023;
            this = ctx->ctx;
          }
          pSVar4 = variable->scope;
          if ((pSVar4 == this->globalScope) || (pSVar4->ownerNamespace != (NamespaceData *)0x0)) {
            pcVar5 = "static ";
            if (cVar6 != '\0') goto LAB_00146023;
          }
          else {
            pSVar4 = ExpressionContext::GlobalScopeFrom(this,pSVar4);
            pcVar5 = "static ";
            if (pSVar4 == (ScopeData *)0x0) goto LAB_00146073;
LAB_00146023:
            Print(ctx,pcVar5);
          }
          TranslateTypeName(ctx,variable->type);
          Print(ctx," ");
          TranslateVariableName(ctx,variable);
          Print(ctx,";");
          OutputContext::Print(ctx->output,"\n",1);
        }
        else {
          pcVar5 = "extern ";
          if (cVar6 == '\0') goto LAB_00146023;
        }
      }
LAB_00146073:
      uVar7 = uVar7 + 1;
      this = ctx->ctx;
    } while (uVar7 < (this->variables).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleGlobalVariables(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Global variables");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->type == ctx.ctx.typeVoid)
			continue;

		bool isInternalFunctionContext = false;

		if(TypeRef *typeRef = getType<TypeRef>(variable->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
				isInternalFunctionContext = typeClass->isInternal;
		}

		InplaceStr name = variable->name->name;

		if(variable->importModule)
		{
			// Skip internal function context
			if(isInternalFunctionContext)
				continue;

			Print(ctx, "extern ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace)
		{
			// Do not export internal function context
			if(isInternalFunctionContext)
				Print(ctx, "static ");

			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}